

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

sexp sexp_complex_asin(sexp ctx,sexp z)

{
  sexp psVar1;
  sexp tmp2;
  sexp tmp;
  sexp_conflict local_70;
  sexp local_68;
  sexp local_60;
  sexp_gc_var_t local_58;
  sexp_gc_var_t local_48;
  sexp_gc_var_t local_38;
  
  local_38.var = &local_60;
  local_60 = (sexp)0x43e;
  local_48.var = &local_68;
  local_68 = (sexp)0x43e;
  local_58.var = &local_70;
  local_70 = (sexp_conflict)0x43e;
  local_48.next = &local_38;
  local_38.next = (ctx->value).context.saves;
  local_58.next = &local_48;
  (ctx->value).context.saves = &local_58;
  local_60 = sexp_complex_mul(ctx,z,z);
  local_60 = sexp_sub(ctx,(sexp)&DAT_00000003,local_60);
  local_60 = sexp_sqrt(ctx,(sexp)0x0,1,local_60);
  local_68 = sexp_make_complex(ctx,(sexp)&DAT_00000001,(sexp)&DAT_00000001);
  psVar1 = sexp_mul(ctx,(sexp)&DAT_ffffffffffffffff,(z->value).type.cpl);
  (local_68->value).type.name = psVar1;
  (local_68->value).type.cpl = (sexp)(z->value).flonum;
  local_60 = sexp_add(ctx,local_68,local_60);
  local_60 = sexp_log(ctx,(sexp)0x0,1,local_60);
  local_68 = sexp_make_complex(ctx,(sexp)&DAT_00000001,(sexp)&DAT_ffffffffffffffff);
  psVar1 = sexp_mul(ctx,local_60,local_68);
  (ctx->value).context.saves = local_38.next;
  return psVar1;
}

Assistant:

sexp sexp_complex_asin (sexp ctx, sexp z) {
  sexp_gc_var3(res, tmp, tmp2);
  sexp_gc_preserve3(ctx, res, tmp, tmp2);
  res = sexp_complex_mul(ctx, z, z);
  res = sexp_sub(ctx, SEXP_ONE, res);
  res = sexp_sqrt(ctx, NULL, 1, res);
  tmp = sexp_make_complex(ctx, SEXP_ZERO, SEXP_ZERO);
  sexp_complex_real(tmp) = sexp_mul(ctx, SEXP_NEG_ONE, sexp_complex_imag(z));
  sexp_complex_imag(tmp) = sexp_complex_real(z);
  res = sexp_add(ctx, tmp, res);
  res = sexp_log(ctx, NULL, 1, res);
  tmp = sexp_make_complex(ctx, SEXP_ZERO, SEXP_NEG_ONE);
  res = sexp_mul(ctx, res, tmp);
  sexp_gc_release3(ctx);
  return res;
}